

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateBuiltInsAtDefinition
          (BuiltInsValidator *this)

{
  Decoration *decoration;
  BuiltInsValidator *pBVar1;
  _Rb_tree_color _Var2;
  bool bVar3;
  undefined4 uVar4;
  spv_result_t sVar5;
  spv_result_t sVar6;
  int32_t iVar7;
  StorageClass SVar8;
  Instruction *inst;
  undefined1 auVar9 [8];
  _Rb_tree_node_base *p_Var10;
  long *plVar11;
  long lVar12;
  ostream *poVar13;
  DiagnosticStream *pDVar14;
  _Base_ptr p_Var15;
  spv_operand_desc psVar16;
  Instruction *pIVar17;
  Instruction *inst_00;
  _Any_data *p_Var18;
  spv_result_t unaff_R13D;
  uint32_t vuid;
  uint32_t uVar19;
  char cVar20;
  uint32_t vuid_1;
  uint32_t num_cols;
  uint32_t col_type;
  uint32_t underlying_type;
  uint32_t component_type;
  uint32_t num_rows;
  ostringstream ss;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  code *local_288;
  code *pcStack_280;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [28];
  spv_ext_inst_type_t sStack_234;
  Extension *local_230;
  spv_parsed_operand_t *local_228 [2];
  _Any_data local_218;
  undefined1 local_208 [8];
  Function *pFStack_200;
  ios_base local_1a8 [352];
  spv_result_t local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  p_Var15 = (this->_->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->_->id_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var15 != local_40) {
    do {
      if (p_Var15[2]._M_left == (_Base_ptr)0x0) {
        cVar20 = '\x03';
      }
      else {
        inst = ValidationState_t::FindDef(this->_,p_Var15[1]._M_color);
        if (inst == (Instruction *)0x0) {
          __assert_fail("inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                        ,0x119a,
                        "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateBuiltInsAtDefinition()"
                       );
        }
        p_Var10 = *(_Rb_tree_node_base **)(p_Var15 + 2);
        local_38 = p_Var15;
        sVar5 = local_250._16_4_;
        local_250._16_4_ = unaff_R13D;
        while (unaff_R13D = local_250._16_4_, p_Var10 != (_Rb_tree_node_base *)&p_Var15[1]._M_left)
        {
          cVar20 = '\x05';
          if (p_Var10[1]._M_color != 0xb) goto LAB_001a8908;
          _Var2 = (p_Var10[1]._M_parent)->_M_color;
          bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
          sVar5 = SPV_SUCCESS;
          sVar6 = SPV_SUCCESS;
          if (!bVar3) goto switchD_001a7b79_caseD_14a8;
          decoration = (Decoration *)(p_Var10 + 1);
          if (0x1395 < (int)_Var2) {
            if ((int)_Var2 < 0x14e7) {
              sVar6 = SPV_SUCCESS;
              switch(_Var2) {
              case 0x14a6:
              case 0x14a7:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                  _Var2 = (p_Var10[1]._M_parent)->_M_color;
                  local_208 = (undefined1  [8])0x0;
                  pFStack_200 = (Function *)0x0;
                  local_218._M_unused._M_object = (void *)0x0;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                  pFStack_200 = (Function *)
                                std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2895:13)>
                                ::_M_invoke;
                  local_208 = (undefined1  [8])
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2895:13)>
                              ::_M_manager;
                  sVar6 = ValidateF32Vec(this,decoration,inst,3,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                  if (local_208 != (undefined1  [8])0x0) {
                    (*(code *)local_208)(&local_218,&local_218,3);
                  }
                  if (sVar6 != SPV_SUCCESS) break;
                }
                sVar6 = ValidateFragmentShaderF32Vec3InputAtReference
                                  (this,decoration,inst,inst,inst);
                break;
              case 0x14a8:
              case 0x14a9:
              case 0x14aa:
              case 0x14ab:
              case 0x14b1:
              case 0x14b2:
              case 0x14b3:
              case 0x14b4:
              case 0x14b5:
              case 0x14b6:
              case 0x14b7:
              case 0x14b8:
              case 0x14b9:
              case 0x14ba:
              case 0x14bb:
              case 0x14bc:
              case 0x14bd:
              case 0x14be:
              case 0x14bf:
              case 0x14c0:
              case 0x14c1:
              case 0x14c2:
              case 0x14c3:
              case 0x14c4:
              case 0x14c5:
              case 0x14c6:
              case 0x14d0:
              case 0x14d1:
                break;
              case 0x14ac:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                  local_2b8._0_4_ = (p_Var10[1]._M_parent)->_M_color;
                  local_208 = (undefined1  [8])0x0;
                  pFStack_200 = (Function *)0x0;
                  local_218._M_unused._M_object = (void *)0x0;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  *(undefined1 **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header = local_2b8;
                  pFStack_200 = (Function *)
                                std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3618:13)>
                                ::_M_invoke;
                  local_208 = (undefined1  [8])
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3618:13)>
                              ::_M_manager;
                  sVar6 = ValidateI32Vec(this,decoration,inst,2,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                  if (local_208 != (undefined1  [8])0x0) {
                    (*(code *)local_208)(&local_218,&local_218,3);
                  }
                  if (sVar6 != SPV_SUCCESS) break;
                }
                sVar6 = ValidateFragSizeAtReference(this,decoration,inst,inst,inst);
                break;
              case 0x14ad:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                  local_2b8._0_4_ = (p_Var10[1]._M_parent)->_M_color;
                  local_208 = (undefined1  [8])0x0;
                  pFStack_200 = (Function *)0x0;
                  local_218._M_unused._M_object = (void *)0x0;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  *(undefined1 **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header = local_2b8;
                  pFStack_200 = (Function *)
                                std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3548:13)>
                                ::_M_invoke;
                  local_208 = (undefined1  [8])
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3548:13)>
                              ::_M_manager;
                  sVar6 = ValidateI32(this,decoration,inst,
                                      (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                       *)&local_218);
                  if (local_208 != (undefined1  [8])0x0) {
                    (*(code *)local_208)(&local_218,&local_218,3);
                  }
                  if (sVar6 != SPV_SUCCESS) break;
                }
                sVar6 = ValidateFragInvocationCountAtReference(this,decoration,inst,inst,inst);
                break;
              case 0x14ae:
              case 0x14af:
              case 0x14b0:
                bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                if (bVar3) {
                  if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                  _Var2 = (p_Var10[1]._M_parent)->_M_color;
                  uVar4 = 0;
                  lVar12 = 0xc;
                  do {
                    if (*(_Rb_tree_color *)((long)&UINT_00254724 + lVar12) == _Var2) {
                      uVar4 = *(undefined4 *)
                               ((long)&(anonymous_namespace)::builtinVUIDInfo + lVar12);
                      break;
                    }
                    bVar3 = lVar12 != 0x26c;
                    lVar12 = lVar12 + 0x10;
                  } while (bVar3);
                  local_2b8._0_4_ = uVar4;
                  sVar6 = SPV_SUCCESS;
                  if (_Var2 == 0x14ae) {
                    local_208 = (undefined1  [8])0x0;
                    pFStack_200 = (Function *)0x0;
                    local_218._M_unused._M_object = (void *)0x0;
                    local_218._8_8_ = (Instruction *)0x0;
                    local_218._M_unused._M_object = operator_new(0x20);
                    ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                    *(Instruction **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl = inst;
                    *(Decoration **)
                     &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                    (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2b8;
                    pFStack_200 = (Function *)
                                  std::
                                  _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4196:15)>
                                  ::_M_invoke;
                    local_208 = (undefined1  [8])
                                std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4196:15)>
                                ::_M_manager;
                    sVar5 = ValidateI32Arr(this,decoration,inst,
                                           (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                            *)&local_218);
                    if (local_208 != (undefined1  [8])0x0) {
                      (*(code *)local_208)(&local_218,&local_218,3);
                    }
                    sVar6 = sVar5;
                    if (sVar5 == SPV_SUCCESS) goto LAB_001a7f7b;
LAB_001a802f:
                    bVar3 = false;
                    sVar6 = sVar5;
                  }
                  else {
LAB_001a7f7b:
                    if (_Var2 == 0x14af) {
                      local_208 = (undefined1  [8])0x0;
                      pFStack_200 = (Function *)0x0;
                      local_218._M_unused._M_object = (void *)0x0;
                      local_218._8_8_ = (Instruction *)0x0;
                      local_218._M_unused._M_object = operator_new(0x20);
                      ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ =
                           (ValidationState_t *)this;
                      *(Instruction **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl = inst;
                      *(Decoration **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl.super__Rb_tree_header._M_header =
                           decoration;
                      (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2b8
                      ;
                      pFStack_200 = (Function *)
                                    std::
                                    _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4214:15)>
                                    ::_M_invoke;
                      local_208 = (undefined1  [8])
                                  std::
                                  _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4214:15)>
                                  ::_M_manager;
                      sVar5 = ValidateArrayedI32Vec
                                        (this,decoration,inst,2,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                      if (local_208 != (undefined1  [8])0x0) {
                        (*(code *)local_208)(&local_218,&local_218,3);
                      }
                      if (sVar5 != SPV_SUCCESS) goto LAB_001a802f;
                    }
                    bVar3 = true;
                    if (_Var2 == 0x14b0) {
                      local_208 = (undefined1  [8])0x0;
                      pFStack_200 = (Function *)0x0;
                      local_218._M_unused._M_object = (void *)0x0;
                      local_218._8_8_ = (Instruction *)0x0;
                      local_218._M_unused._M_object = operator_new(0x20);
                      ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ =
                           (ValidationState_t *)this;
                      *(Instruction **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl = inst;
                      *(Decoration **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl.super__Rb_tree_header._M_header =
                           decoration;
                      (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)
                      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_2b8
                      ;
                      pFStack_200 = (Function *)
                                    std::
                                    _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4233:15)>
                                    ::_M_invoke;
                      local_208 = (undefined1  [8])
                                  std::
                                  _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4233:15)>
                                  ::_M_manager;
                      sVar5 = ValidateArrayedI32Vec
                                        (this,decoration,inst,3,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                      if (local_208 != (undefined1  [8])0x0) {
                        (*(code *)local_208)(&local_218,&local_218,3);
                      }
                      bVar3 = sVar5 == SPV_SUCCESS;
                      if (!bVar3) {
                        sVar6 = sVar5;
                      }
                    }
                  }
                  if (!bVar3) break;
                }
                sVar6 = ValidateMeshShadingEXTBuiltinsAtReference(this,decoration,inst,inst,inst);
                break;
              case 0x14c7:
              case 0x14c8:
              case 0x14c9:
              case 0x14ca:
              case 0x14cb:
              case 0x14cc:
              case 0x14cd:
              case 0x14ce:
              case 0x14cf:
              case 0x14d2:
              case 0x14d3:
              case 0x14d4:
              case 0x14d5:
                goto switchD_001a7b79_caseD_14c7;
              default:
                if (_Var2 == 0x1396) {
                  bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                  if (bVar3) {
                    if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                    local_250._24_4_ = (p_Var10[1]._M_parent)->_M_color;
                    local_288 = (_Manager_type)0x0;
                    pcStack_280 = (_Invoker_type)0x0;
                    local_298._0_8_ = (void *)0x0;
                    local_298._8_8_ = 0;
                    local_298._0_8_ = operator_new(0x18);
                    *(BuiltInsValidator **)local_298._0_8_ = this;
                    *(Instruction **)(local_298._0_8_ + 8) = inst;
                    *(undefined1 **)(local_298._0_8_ + 0x10) = local_250 + 0x18;
                    pcStack_280 = std::
                                  _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3688:13)>
                                  ::_M_invoke;
                    local_288 = std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3688:13)>
                                ::_M_manager;
                    local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
                    pIVar17 = (Instruction *)local_260;
                    sVar6 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)pIVar17);
                    if (sVar6 == SPV_SUCCESS) {
                      bVar3 = ValidationState_t::IsIntScalarType(this->_,local_260._0_4_);
                      sVar6 = SPV_SUCCESS;
                      if (!bVar3) {
                        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                                  ((string *)local_2b8,decoration,(Decoration *)inst,pIVar17);
                        plVar11 = (long *)std::__cxx11::string::append((char *)local_2b8);
                        pBVar1 = (BuiltInsValidator *)(plVar11 + 2);
                        if ((BuiltInsValidator *)*plVar11 == pBVar1) {
                          local_208 = (undefined1  [8])pBVar1->_;
                          pFStack_200 = (Function *)plVar11[3];
                          local_218._M_unused._M_object = (BuiltInsValidator *)local_208;
                        }
                        else {
                          local_208 = (undefined1  [8])pBVar1->_;
                          local_218._M_unused._M_object = (BuiltInsValidator *)*plVar11;
                        }
                        local_218._8_8_ = plVar11[1];
                        *plVar11 = (long)pBVar1;
                        plVar11[1] = 0;
                        *(undefined1 *)(plVar11 + 2) = 0;
                        if ((ValidationState_t *)local_288 == (ValidationState_t *)0x0)
                        goto LAB_001aa5f9;
                        sVar6 = (*pcStack_280)(local_298,&local_218);
                        if ((BuiltInsValidator *)local_218._M_unused._0_8_ !=
                            (BuiltInsValidator *)local_208) {
                          operator_delete(local_218._M_unused._M_object,
                                          (ulong)((long)(spv_const_context *)local_208 + 1));
                        }
                        if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)local_2a8) {
                          operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
                        }
                      }
                    }
                    if ((ValidationState_t *)local_288 != (ValidationState_t *)0x0) {
                      (*local_288)(local_298,local_298,3);
                    }
                    if (sVar6 != SPV_SUCCESS) break;
                  }
                  sVar6 = ValidateFragStencilRefAtReference(this,decoration,inst,inst,inst);
                }
                else {
                  sVar6 = SPV_SUCCESS;
                  if (_Var2 == 0x1490) {
                    bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
                    if (bVar3) {
                      if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                      local_2b8._0_4_ = (p_Var10[1]._M_parent)->_M_color;
                      local_208 = (undefined1  [8])0x0;
                      pFStack_200 = (Function *)0x0;
                      local_218._M_unused._M_object = (void *)0x0;
                      local_218._8_8_ = (Instruction *)0x0;
                      local_218._M_unused._M_object = operator_new(0x18);
                      ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ =
                           (ValidationState_t *)this;
                      *(Instruction **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl = inst;
                      *(undefined1 **)
                       &(((BuiltInsValidator *)local_218._M_unused._0_8_)->
                        id_to_at_reference_checks_)._M_t._M_impl.super__Rb_tree_header._M_header =
                           local_2b8;
                      pFStack_200 = (Function *)
                                    std::
                                    _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3758:13)>
                                    ::_M_invoke;
                      local_208 = (undefined1  [8])
                                  std::
                                  _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3758:13)>
                                  ::_M_manager;
                      sVar6 = ValidateBool(this,decoration,inst,
                                           (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                            *)&local_218);
                      if (local_208 != (undefined1  [8])0x0) {
                        (*(code *)local_208)(&local_218,&local_218,3);
                      }
                      if (sVar6 != SPV_SUCCESS) break;
                    }
                    sVar6 = ValidateFullyCoveredAtReference(this,decoration,inst,inst,inst);
                  }
                }
              }
            }
            else if (_Var2 - 0x14fe < 4) {
LAB_001a804d:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3827:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3827:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) goto switchD_001a7b79_caseD_14a8;
              }
              sVar6 = ValidateNVSMOrARMCoreBuiltinsAtReference(this,decoration,inst,inst,inst);
            }
            else if ((_Var2 - 0x14e7 < 2) || (sVar6 = SPV_SUCCESS, _Var2 == 0x1785))
            goto switchD_001a7b79_caseD_14c7;
            goto switchD_001a7b79_caseD_14a8;
          }
          sVar6 = sVar5;
          switch(_Var2) {
          case _S_red:
            sVar6 = ValidatePositionAtReference(this,decoration,inst,inst,inst);
            break;
          case _S_black:
            sVar6 = ValidatePointSizeAtReference(this,decoration,inst,inst,inst);
            break;
          case 2:
          case 0x15:
          case 0x1e:
          case 0x1f:
          case 0x20:
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x25:
          case 0x27:
            break;
          case 3:
          case 4:
            sVar6 = ValidateClipOrCullDistanceAtReference(this,decoration,inst,inst,inst);
            break;
          case 5:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_218._M_pod_data,
                         "Vulkan spec doesn\'t allow BuiltIn VertexId to be used.",0x36);
              sVar6 = local_48;
LAB_001a8ecc:
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            }
            break;
          case 6:
switchD_001a7b79_caseD_14c7:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (!bVar3) goto LAB_001a88d9;
            if (decoration->dec_type_ != BuiltIn) {
LAB_001aa5bb:
              __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/decoration.h"
                            ,0x4f,"spv::BuiltIn spvtools::val::Decoration::builtin() const");
            }
            _Var2 = (p_Var10[1]._M_parent)->_M_color;
            switch(_Var2) {
            case 0x14c7:
            case 0x14c8:
              local_208 = (undefined1  [8])0x0;
              pFStack_200 = (Function *)0x0;
              local_218._M_unused._M_object = (void *)0x0;
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4093:17)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4093:17)>
                          ::_M_manager;
              sVar6 = ValidateI32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              break;
            case 0x14c9:
            case 0x14ca:
            case 0x14cb:
            case 0x14cc:
              local_208 = (undefined1  [8])0x0;
              pFStack_200 = (Function *)0x0;
              local_218._M_unused._M_object = (void *)0x0;
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4073:17)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4073:17)>
                          ::_M_manager;
              sVar6 = ValidateF32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              break;
            case 0x14cd:
            case 0x14ce:
            case 0x14d4:
              local_208 = (undefined1  [8])0x0;
              pFStack_200 = (Function *)0x0;
              local_218._M_unused._M_object = (void *)0x0;
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4029:17)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4029:17)>
                          ::_M_manager;
              sVar6 = ValidateF32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              break;
            case 0x14d0:
            case 0x14d1:
            case 0x14d6:
            case 0x14d7:
            case 0x14d8:
            case 0x14d9:
            case 0x14da:
            case 0x14db:
            case 0x14dc:
            case 0x14dd:
            case 0x14de:
            case 0x14df:
            case 0x14e0:
            case 0x14e1:
            case 0x14e2:
            case 0x14e3:
            case 0x14e4:
            case 0x14e5:
            case 0x14e6:
switchD_001a7bc5_caseD_14d0:
              __assert_fail("0 && \"Unexpected ray tracing builtin\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp"
                            ,0x1022,
                            "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateRayTracingBuiltinsAtDefinition(const Decoration &, const Instruction &)"
                           );
            case 0x14d2:
            case 0x14d3:
              local_288 = (_Manager_type)0x0;
              pcStack_280 = (_Invoker_type)0x0;
              local_298._0_8_ = (void *)0x0;
              local_298._8_8_ = 0;
              local_298._0_8_ = operator_new(0x18);
              *(BuiltInsValidator **)local_298._0_8_ = this;
              *(Instruction **)(local_298._0_8_ + 8) = inst;
              *(_Rb_tree_color *)(local_298._0_8_ + 0x10) = _Var2;
              pcStack_280 = std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4113:17)>
                            ::_M_invoke;
              local_288 = std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4113:17)>
                          ::_M_manager;
              local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
              local_250._24_4_ = _S_red;
              local_270._0_8_ = local_270._0_8_ & 0xffffffff00000000;
              local_270._12_4_ = SPV_OPERAND_TYPE_NONE;
              local_250._20_4_ = 0;
              sVar6 = GetUnderlyingType(this->_,decoration,inst,(uint32_t *)local_260);
              if (sVar6 == SPV_SUCCESS) {
                pIVar17 = (Instruction *)local_270;
                bVar3 = ValidationState_t::GetMatrixTypeInfo
                                  (this->_,local_260._0_4_,(uint32_t *)(local_250 + 0x18),
                                   (uint32_t *)pIVar17,(uint32_t *)(local_270 + 0xc),
                                   (uint32_t *)(local_250 + 0x14));
                if (((bVar3) && (local_250._24_4_ == 3)) &&
                   (local_270._0_4_ == SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID)) {
                  sVar6 = ValidateF32VecHelper
                                    (this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)local_298,local_270._12_4_);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218._M_pod_data)
                  ;
                  (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                            ((string *)local_2b8,decoration,(Decoration *)inst,pIVar17);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_218._M_pod_data,(char *)local_2b8._0_8_,
                                       local_2b8._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13," has columns ",0xd);
                  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13," and rows ",10);
                  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13," not equal to expected ",0x17);
                  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"x",1);
                  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
                  if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)local_2a8) {
                    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
                  }
                  std::__cxx11::stringbuf::str();
                  if ((ValidationState_t *)local_288 == (ValidationState_t *)0x0) {
LAB_001aa5f9:
                    std::__throw_bad_function_call();
                  }
                  sVar6 = (*pcStack_280)(local_298,local_2b8);
                  if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)local_2a8) {
                    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
                  }
                  std::__cxx11::ostringstream::~ostringstream
                            ((ostringstream *)local_218._M_pod_data);
                  std::ios_base::~ios_base(local_1a8);
                }
              }
              if ((ValidationState_t *)local_288 != (ValidationState_t *)0x0) {
                p_Var18 = (_Any_data *)local_298;
                auVar9 = (undefined1  [8])local_288;
                goto LAB_001a88c3;
              }
              goto LAB_001a88ca;
            default:
              if ((_Var2 != 6) && (_Var2 != 0x1785)) goto switchD_001a7bc5_caseD_14d0;
            case 0x14cf:
            case 0x14d5:
            case 0x14e7:
            case 0x14e8:
              local_208 = (undefined1  [8])0x0;
              pFStack_200 = (Function *)0x0;
              local_218._M_unused._M_object = (void *)0x0;
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4052:17)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:4052:17)>
                          ::_M_manager;
              sVar6 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
            }
            p_Var18 = &local_218;
            auVar9 = local_208;
            if (local_208 != (undefined1  [8])0x0) {
LAB_001a88c3:
              (*(code *)auVar9)(p_Var18,p_Var18,3);
            }
LAB_001a88ca:
            if (sVar6 == SPV_SUCCESS) {
LAB_001a88d9:
              sVar6 = ValidateRayTracingBuiltinsAtReference(this,decoration,inst,inst,inst);
            }
            break;
          case 7:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (p_Var10[2]._M_color == ~_S_red) {
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2147:15)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2147:15)>
                            ::_M_manager;
                local_218._M_unused._M_object = this;
                local_218._8_8_ = inst;
                sVar6 = ValidateOptionalArrayedI32
                                  (this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              }
              else {
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2135:15)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2135:15)>
                            ::_M_manager;
                local_218._M_unused._M_object = this;
                local_218._8_8_ = inst;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
              }
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidatePrimitiveIdAtReference(this,decoration,inst,inst,inst);
            break;
          case 8:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1637:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1637:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateInvocationIdAtReference(this,decoration,inst,inst,inst);
            break;
          case 9:
          case 10:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (p_Var10[2]._M_color == ~_S_red) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = decoration;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = inst;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2752:15)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2752:15)>
                            ::_M_manager;
                sVar6 = ValidateOptionalArrayedI32
                                  (this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              }
              else {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = decoration;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = inst;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2734:15)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2734:15)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
              }
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateLayerOrViewportIndexAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xb:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2512:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2512:13)>
                          ::_M_manager;
              uVar19 = 4;
LAB_001a93b5:
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateF32Arr(this,decoration,inst,uVar19,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            goto LAB_001a93e4;
          case 0xc:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2533:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2533:13)>
                          ::_M_manager;
              uVar19 = 2;
              goto LAB_001a93b5;
            }
LAB_001a93e4:
            sVar6 = ValidateTessLevelAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xd:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2452:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2452:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateF32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateTessCoordAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xe:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1758:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1758:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidatePatchVerticesAtReference(this,decoration,inst,inst,inst);
            break;
          case 0xf:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1378:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1378:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateF32Vec(this,decoration,inst,4,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateFragCoordAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x10:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1819:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1819:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateF32Vec(this,decoration,inst,2,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidatePointCoordAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x11:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1516:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1516:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateBool(this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateFrontFacingAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x12:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2270:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2270:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateSampleIdAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x13:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2390:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2390:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateF32Vec(this,decoration,inst,2,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateSamplePositionAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x14:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2329:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2329:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32Arr(this,decoration,inst,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateSampleMaskAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x16:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1440:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1440:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateF32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateFragDepthAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x17:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1577:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1577:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateBool(this,decoration,inst,
                                   (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateHelperInvocationAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x18:
          case 0x1a:
          case 0x1b:
          case 0x1c:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
              _Var2 = (p_Var10[1]._M_parent)->_M_color;
              local_208 = (undefined1  [8])0x0;
              pFStack_200 = (Function *)0x0;
              local_218._M_unused._M_object = (void *)0x0;
              local_218._8_8_ = (Instruction *)0x0;
              local_218._M_unused._M_object = operator_new(0x18);
              ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
              *(Instruction **)
               &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl = inst;
              (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
              _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2969:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2969:13)>
                          ::_M_manager;
              sVar6 = ValidateI32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateComputeShaderI32Vec3InputAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x19:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if ((bVar3) && (iVar7 = spvOpcodeIsConstant((uint)(inst->inst_).opcode), iVar7 == 0))
              {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                ValidationState_t::VkErrorID_abi_cxx11_
                          ((string *)local_2b8,this->_,0x114a,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2b8._0_8_,local_2b8._8_8_)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,
                           "Vulkan spec requires BuiltIn WorkgroupSize to be a constant. ",0x3d);
                (anonymous_namespace)::GetIdDesc_abi_cxx11_
                          ((string *)local_298,(_anonymous_namespace_ *)inst,inst_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_298._0_8_,local_298._8_8_)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," is not a constant.",0x13);
                sVar6 = local_48;
                if ((code **)local_298._0_8_ != &local_288) {
                  operator_delete((void *)local_298._0_8_,(ulong)((long)local_288 + 1));
                }
                if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)local_2a8) {
                  operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
                }
                goto LAB_001a8ecc;
              }
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3230:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3230:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32Vec(this,decoration,inst,3,
                                     (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateWorkgroupSizeAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x1d:
            ValidateLocalInvocationIndexAtReference
                      (this,decoration,inst,(Instruction *)&switchD_001a7c53::switchdataD_0025423c,
                       inst);
            break;
          case 0x24:
          case 0x29:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
              _Var2 = (p_Var10[1]._M_parent)->_M_color;
              if (p_Var10[2]._M_color == ~_S_red) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3140:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3140:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) goto LAB_001aa1f3;
                SVar8 = GetStorageClass(inst);
                bVar3 = true;
                if ((SVar8 != Input) && (SVar8 != Max)) {
                  uVar19 = 0;
                  lVar12 = 8;
                  do {
                    if (*(_Rb_tree_color *)((long)&UINT_00254728 + lVar12) == _Var2) {
                      uVar19 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar12)
                      ;
                      break;
                    }
                    bVar3 = lVar12 != 0x268;
                    lVar12 = lVar12 + 0x10;
                  } while (bVar3);
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_
                            ((string *)local_2b8,this->_,uVar19,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,(char *)local_2b8._0_8_,
                             local_2b8._8_8_);
                  spvLogStringForEnv_abi_cxx11_((string *)local_298,this->_->context_->target_env);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,(char *)local_298._0_8_,
                             local_298._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data," spec allows BuiltIn ",0x15);
                  local_260._0_8_ = (spv_operand_desc)0x0;
                  sVar5 = AssemblyGrammar::lookupOperand
                                    (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                     (spv_operand_desc *)local_260);
                  if ((spv_operand_desc)local_260._0_8_ == (spv_operand_desc)0x0 ||
                      sVar5 != SPV_SUCCESS) {
                    local_270._0_8_ = "Unknown";
                  }
                  else {
                    local_270._0_8_ = *(undefined8 *)local_260._0_8_;
                  }
                  pDVar14 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&local_218,(char **)local_270);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14,
                             " to be only used for variables with Input storage class. ",0x39);
                  (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                            ((string *)local_260,this,decoration,inst,inst,inst,ExecutionModelMax);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14,(char *)local_260._0_8_,local_260._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar14," ",1);
                  (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                            ((string *)(local_250 + 0x18),this,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14,(char *)CONCAT44(sStack_234,local_250._24_4_),
                             (long)local_230);
                  sVar6 = pDVar14->error_;
                  if ((spv_parsed_operand_t **)CONCAT44(sStack_234,local_250._24_4_) != local_228) {
                    operator_delete((void *)CONCAT44(sStack_234,local_250._24_4_),
                                    (ulong)((long)&local_228[0]->offset + 1));
                  }
                  if ((spv_operand_desc)local_260._0_8_ != (spv_operand_desc)local_250) {
                    operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
                  }
                  if ((code **)local_298._0_8_ != &local_288) {
                    operator_delete((void *)local_298._0_8_,(ulong)((long)local_288 + 1));
                  }
                  if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)local_2a8) {
                    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
                  }
                  goto LAB_001aa1ee;
                }
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"BuiltIn ",8);
                local_2b8._0_8_ = (spv_operand_desc)0x0;
                sVar5 = AssemblyGrammar::lookupOperand
                                  (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                   (spv_operand_desc *)local_2b8);
                if ((spv_operand_desc)local_2b8._0_8_ == (spv_operand_desc)0x0 ||
                    sVar5 != SPV_SUCCESS) {
                  local_2b8._0_8_ = "Unknown";
                }
                else {
                  local_2b8._0_8_ = *(undefined8 *)local_2b8._0_8_;
                }
                pDVar14 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_2b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar14," cannot be used as a member decoration ",0x27);
                sVar6 = pDVar14->error_;
LAB_001aa1ee:
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
LAB_001aa1f3:
                bVar3 = false;
              }
LAB_001aa1f5:
              if (!bVar3) break;
            }
LAB_001aa1fd:
            sVar6 = SPV_SUCCESS;
            break;
          case 0x26:
          case 0x28:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
              _Var2 = (p_Var10[1]._M_parent)->_M_color;
              if (p_Var10[2]._M_color == ~_S_red) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_)._M_t.
                _M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3055:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3055:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                bVar3 = sVar6 == SPV_SUCCESS;
              }
              else {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"BuiltIn ",8);
                local_2b8._0_8_ = (spv_operand_desc)0x0;
                sVar5 = AssemblyGrammar::lookupOperand
                                  (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                   (spv_operand_desc *)local_2b8);
                if ((spv_operand_desc)local_2b8._0_8_ == (spv_operand_desc)0x0 ||
                    sVar5 != SPV_SUCCESS) {
                  local_2b8._0_8_ = "Unknown";
                }
                else {
                  local_2b8._0_8_ = *(undefined8 *)local_2b8._0_8_;
                }
                pDVar14 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)&local_218,(char **)local_2b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar14," cannot be used as a member decoration ",0x27);
                sVar6 = pDVar14->error_;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
                bVar3 = false;
              }
              if (!bVar3) break;
            }
            sVar6 = ValidateComputeI32InputAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x2a:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2636:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:2636:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateVertexIndexAtReference(this,decoration,inst,inst,inst);
            break;
          case 0x2b:
            bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
            if (bVar3) {
              pFStack_200 = (Function *)
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1697:13)>
                            ::_M_invoke;
              local_208 = (undefined1  [8])
                          std::
                          _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:1697:13)>
                          ::_M_manager;
              local_218._M_unused._M_object = this;
              local_218._8_8_ = inst;
              sVar6 = ValidateI32(this,decoration,inst,
                                  (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                   *)&local_218);
              if (local_208 != (undefined1  [8])0x0) {
                (*(code *)local_208)(&local_218,&local_218,3);
              }
              if (sVar6 != SPV_SUCCESS) break;
            }
            sVar6 = ValidateInstanceIndexAtReference(this,decoration,inst,inst,inst);
            break;
          default:
            switch(_Var2) {
            case 0x1140:
            case 0x1141:
            case 0x1142:
            case 0x1143:
            case 0x1144:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                if (decoration->dec_type_ != BuiltIn) goto LAB_001aa5bb;
                _Var2 = (p_Var10[1]._M_parent)->_M_color;
                if (p_Var10[2]._M_color == ~_S_red) {
                  local_208 = (undefined1  [8])0x0;
                  pFStack_200 = (Function *)0x0;
                  local_218._M_unused._M_object = (void *)0x0;
                  local_218._8_8_ = (Instruction *)0x0;
                  local_218._M_unused._M_object = operator_new(0x18);
                  ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                  *(Instruction **)
                   &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                    _M_t._M_impl = inst;
                  (((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var2;
                  pFStack_200 = (Function *)
                                std::
                                _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3183:13)>
                                ::_M_invoke;
                  local_208 = (undefined1  [8])
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3183:13)>
                              ::_M_manager;
                  sVar6 = ValidateI32Vec(this,decoration,inst,4,
                                         (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                          *)&local_218);
                  if (local_208 != (undefined1  [8])0x0) {
                    (*(code *)local_208)(&local_218,&local_218,3);
                  }
                  if (sVar6 != SPV_SUCCESS) goto LAB_001aa1f3;
                  SVar8 = GetStorageClass(inst);
                  bVar3 = true;
                  if ((SVar8 == Input) || (SVar8 == Max)) goto LAB_001aa1f5;
                  uVar19 = 0;
                  lVar12 = 8;
                  do {
                    if (*(_Rb_tree_color *)((long)&UINT_00254728 + lVar12) == _Var2) {
                      uVar19 = *(uint32_t *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar12)
                      ;
                      break;
                    }
                    bVar3 = lVar12 != 0x268;
                    lVar12 = lVar12 + 0x10;
                  } while (bVar3);
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_
                            ((string *)local_2b8,this->_,uVar19,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,(char *)local_2b8._0_8_,
                             local_2b8._8_8_);
                  spvLogStringForEnv_abi_cxx11_((string *)local_298,this->_->context_->target_env);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,(char *)local_298._0_8_,
                             local_298._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data," spec allows BuiltIn ",0x15);
                  local_260._0_8_ = (spv_operand_desc)0x0;
                  sVar5 = AssemblyGrammar::lookupOperand
                                    (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                     (spv_operand_desc *)local_260);
                  local_270._0_8_ = "Unknown";
                  if ((spv_operand_desc)local_260._0_8_ != (spv_operand_desc)0x0 &&
                      sVar5 == SPV_SUCCESS) {
                    local_270._0_8_ = *(undefined8 *)local_260._0_8_;
                  }
                  pDVar14 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&local_218,(char **)local_270);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14,
                             " to be only used for variables with Input storage class. ",0x39);
                  (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                            ((string *)local_260,this,decoration,inst,inst,inst,ExecutionModelMax);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14,(char *)local_260._0_8_,local_260._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar14," ",1);
                  (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                            ((string *)(local_250 + 0x18),this,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14,(char *)CONCAT44(sStack_234,local_250._24_4_),
                             (long)local_230);
                  sVar6 = pDVar14->error_;
                  if ((spv_parsed_operand_t **)CONCAT44(sStack_234,local_250._24_4_) != local_228) {
                    operator_delete((void *)CONCAT44(sStack_234,local_250._24_4_),
                                    (ulong)((long)&local_228[0]->offset + 1));
                  }
                  if ((spv_operand_desc)local_260._0_8_ != (spv_operand_desc)local_250) {
                    operator_delete((void *)local_260._0_8_,(ulong)(local_250._0_8_ + 1));
                  }
                  if ((code **)local_298._0_8_ != &local_288) {
                    operator_delete((void *)local_298._0_8_,(ulong)((long)local_288 + 1));
                  }
                  if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)local_2a8) {
                    operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8._0_8_ + 1));
                  }
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,this->_,SPV_ERROR_INVALID_DATA,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,"BuiltIn ",8);
                  local_2b8._0_8_ = (spv_operand_desc)0x0;
                  sVar5 = AssemblyGrammar::lookupOperand
                                    (&this->_->grammar_,SPV_OPERAND_TYPE_BUILT_IN,_Var2,
                                     (spv_operand_desc *)local_2b8);
                  psVar16 = (spv_operand_desc)0x2616e3;
                  if ((spv_operand_desc)local_2b8._0_8_ != (spv_operand_desc)0x0 &&
                      sVar5 == SPV_SUCCESS) {
                    psVar16 = *(spv_operand_desc *)local_2b8._0_8_;
                  }
                  local_2b8._0_8_ = psVar16;
                  pDVar14 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&local_218,(char **)local_2b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar14," cannot be used as a member decoration ",0x27);
                  sVar6 = pDVar14->error_;
                }
                goto LAB_001aa1ee;
              }
              goto LAB_001aa1fd;
            case 0x1145:
            case 0x1146:
            case 0x1147:
            case 0x114b:
            case 0x114c:
            case 0x114d:
            case 0x114e:
            case 0x114f:
            case 0x1151:
            case 0x1152:
            case 0x1153:
            case 0x1154:
            case 0x1155:
            case 0x1157:
            case 0x1159:
            case 0x115a:
            case 0x115b:
              break;
            case 0x1148:
            case 0x1149:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3286:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3286:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) break;
              }
              sVar6 = ValidateBaseInstanceOrVertexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x114a:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3357:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3357:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) break;
              }
              sVar6 = ValidateDrawIndexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x1150:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3883:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3883:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) break;
              }
              sVar6 = ValidatePrimitiveShadingRateAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x1156:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3493:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3493:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) break;
              }
              sVar6 = ValidateDeviceIndexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x1158:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3428:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3428:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) break;
              }
              sVar6 = ValidateViewIndexAtReference(this,decoration,inst,inst,inst);
              break;
            case 0x115c:
              bVar3 = spvIsVulkanEnv(this->_->context_->target_env);
              if (bVar3) {
                local_208 = (undefined1  [8])0x0;
                pFStack_200 = (Function *)0x0;
                local_218._M_unused._M_object = (void *)0x0;
                local_218._8_8_ = (Instruction *)0x0;
                local_218._M_unused._M_object = operator_new(0x18);
                ((BuiltInsValidator *)local_218._M_unused._0_8_)->_ = (ValidationState_t *)this;
                *(Instruction **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl = inst;
                *(Decoration **)
                 &(((BuiltInsValidator *)local_218._M_unused._0_8_)->id_to_at_reference_checks_).
                  _M_t._M_impl.super__Rb_tree_header._M_header = decoration;
                pFStack_200 = (Function *)
                              std::
                              _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3958:13)>
                              ::_M_invoke;
                local_208 = (undefined1  [8])
                            std::
                            _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_builtins.cpp:3958:13)>
                            ::_M_manager;
                sVar6 = ValidateI32(this,decoration,inst,
                                    (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                     *)&local_218);
                if (local_208 != (undefined1  [8])0x0) {
                  (*(code *)local_208)(&local_218,&local_218,3);
                }
                if (sVar6 != SPV_SUCCESS) break;
              }
              sVar6 = ValidateShadingRateAtReference(this,decoration,inst,inst,inst);
              break;
            default:
              sVar6 = SPV_SUCCESS;
              if (_Var2 - 0x1040 < 5) goto LAB_001a804d;
            }
          }
switchD_001a7b79_caseD_14a8:
          cVar20 = sVar6 != SPV_SUCCESS;
          sVar5 = local_250._16_4_;
          unaff_R13D = local_250._16_4_;
          if ((bool)cVar20) {
            unaff_R13D = sVar6;
          }
LAB_001a8908:
          local_250._16_4_ = sVar5;
          if ((cVar20 != '\x05') && (sVar5 = local_250._16_4_, cVar20 != '\0')) goto LAB_001aa54f;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          sVar5 = local_250._16_4_;
          local_250._16_4_ = unaff_R13D;
        }
        cVar20 = '\x04';
LAB_001aa54f:
        local_250._16_4_ = sVar5;
        p_Var15 = local_38;
        if (cVar20 == '\x04') {
          cVar20 = '\0';
        }
      }
      if ((cVar20 != '\x03') && (cVar20 != '\0')) {
        return unaff_R13D;
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != local_40);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateBuiltInsAtDefinition() {
  for (const auto& kv : _.id_decorations()) {
    const uint32_t id = kv.first;
    const auto& decorations = kv.second;
    if (decorations.empty()) {
      continue;
    }

    const Instruction* inst = _.FindDef(id);
    assert(inst);

    for (const auto& decoration : kv.second) {
      if (decoration.dec_type() != spv::Decoration::BuiltIn) {
        continue;
      }

      if (spv_result_t error =
              ValidateSingleBuiltInAtDefinition(decoration, *inst)) {
        return error;
      }
    }
  }

  return SPV_SUCCESS;
}